

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer
          (DiscardGeometry *this,GLuint primitive_case)

{
  float *pfVar1;
  long *plVar2;
  deUint32 err;
  long lVar3;
  float *pfVar4;
  value_type_conflict2 *__val;
  undefined4 in_register_00000034;
  bool bVar5;
  
  plVar2 = *(long **)(*(long *)(&(this->super_CaptureGeometryInterleaved).field_0x78 +
                               (long)(this->super_CaptureGeometryInterleaved).
                                     _vptr_CaptureGeometryInterleaved[-3]) + 8);
  lVar3 = (**(code **)(*plVar2 + 0x18))(plVar2,CONCAT44(in_register_00000034,primitive_case));
  pfVar4 = (float *)operator_new(0x10);
  pfVar4[0] = 0.0;
  pfVar4[1] = 0.0;
  pfVar4[2] = 0.0;
  pfVar4[3] = 0.0;
  (**(code **)(lVar3 + 0x1220))(0,0,2,2,0x1903,0x1406,pfVar4);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1081);
  if (ABS(*pfVar4) <= 0.0625) {
    lVar3 = 4;
    do {
      bVar5 = lVar3 == 0x10;
      if (bVar5) break;
      pfVar1 = (float *)((long)pfVar4 + lVar3);
      lVar3 = lVar3 + 4;
    } while (ABS(*pfVar1) <= 0.0625);
  }
  else {
    bVar5 = false;
  }
  operator_delete(pfVar4,0x10);
  return bVar5;
}

Assistant:

bool gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer(glw::GLuint primitive_case UNUSED)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(s_framebuffer_size * s_framebuffer_size);

	if ((s_framebuffer_size > 0) && (s_framebuffer_size > 0))
	{
		gl.readPixels(0, 0, s_framebuffer_size, s_framebuffer_size, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Check results.
	 Note: assuming that s_buffer_size == 2 -> then all points shall be drawn. */
	for (std::vector<glw::GLfloat>::iterator i = pixels.begin(); i != pixels.end(); ++i)
	{
		if (fabs(*i) > 0.0625f /* precision */)
		{
			return false;
		}
	}

	return true;
}